

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall Fifteen::initGame(Fifteen *this)

{
  _Rb_tree_header *p_Var1;
  Controller *__ptr_00;
  MenuBar *pMVar2;
  Data *pDVar3;
  pointer __p_1;
  Controller *this_00;
  TilesBoard *pTVar4;
  pointer __p_00;
  pointer __p_01;
  QVBoxLayout *pQVar5;
  QWidget *pQVar6;
  QHBoxLayout *this_01;
  QGroupBox *pQVar7;
  _Any_data *p_Var8;
  pointer *__ptr;
  pointer __p;
  long lVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  array<std::function<void_()>,_3UL> panelSlots;
  QString local_178;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  undefined8 *local_138;
  undefined8 uStack_130;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108 [2];
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_158._M_unused._M_object = (void *)0x25800000352;
  QWidget::resize((QSize *)this);
  this_00 = (Controller *)operator_new(0x18);
  Controller::Controller(this_00);
  local_158._M_unused._M_object = (Controller *)0x0;
  __ptr_00 = (this->controller)._M_t.
             super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
             super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
             super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
  (this->controller)._M_t.super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
  super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
  super__Head_base<0UL,_Controller_*,_false>._M_head_impl = this_00;
  if (__ptr_00 != (Controller *)0x0) {
    std::default_delete<Controller>::operator()
              ((default_delete<Controller> *)&this->controller,__ptr_00);
  }
  if ((Controller *)local_158._M_unused._0_8_ != (Controller *)0x0) {
    std::default_delete<Controller>::operator()
              ((default_delete<Controller> *)local_158._M_pod_data,
               (Controller *)local_158._M_unused._0_8_);
  }
  pTVar4 = (TilesBoard *)operator_new(0x58);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = (char16_t *)0x0;
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = operator_new(0x18);
  *(code **)local_158._M_unused._0_8_ = pressTile;
  *(undefined8 *)((long)local_158._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_158._M_unused._0_8_ + 0x10) = this;
  pcStack_140 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                _M_invoke;
  local_148 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
              _M_manager;
  TilesBoard::TilesBoard(pTVar4,(function<void_()> *)&local_158);
  local_178.d.d = (Data *)pTVar4;
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  pDVar3 = local_178.d.d;
  local_178.d.d = (Data *)0x0;
  pTVar4 = (this->tilesBoard)._M_t.
           super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
           super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
           super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl;
  (this->tilesBoard)._M_t.super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
  super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
  super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl = (TilesBoard *)pDVar3;
  if (pTVar4 != (TilesBoard *)0x0) {
    std::default_delete<TilesBoard>::operator()
              ((default_delete<TilesBoard> *)&this->tilesBoard,pTVar4);
  }
  if ((TilesBoard *)local_178.d.d != (TilesBoard *)0x0) {
    std::default_delete<TilesBoard>::operator()
              ((default_delete<TilesBoard> *)&local_178,(TilesBoard *)local_178.d.d);
  }
  __p_00 = (pointer)operator_new(0x60);
  p_Var1 = &(__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__p_00->radioModeMap)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__p_00->radioSizeMap)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__uniq_ptr_impl<Panel,_std::default_delete<Panel>_>::reset
            ((__uniq_ptr_impl<Panel,_std::default_delete<Panel>_> *)&this->panel,__p_00);
  __p_01 = (pointer)operator_new(0x30);
  p_Var1 = &(__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__p_01->mapAction)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_unused._M_object = (QArrayData *)0x0;
  std::__uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>::reset
            ((__uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_> *)&this->menuBar,__p_01);
  std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::~unique_ptr
            ((unique_ptr<MenuBar,_std::default_delete<MenuBar>_> *)&local_158);
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = slotLoadGraphic;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
               _M_invoke;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar10.m_data = (storage_type *)0x11;
  QVar10.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar10);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,OPEN_GRAPHIC,(function<void_()> *)&local_58,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(code **)local_78._M_unused._0_8_ = slotRemoveGraphic;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_78._M_unused._0_8_ + 0x10) = this;
  pcStack_60 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
               _M_invoke;
  local_68 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar11.m_data = (storage_type *)0xe;
  QVar11.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar11);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,REM_GRAPHIC,(function<void_()> *)&local_78,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  *(code **)local_98._M_unused._0_8_ = slotSaveBoard;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_98._M_unused._0_8_ + 0x10) = this;
  pcStack_80 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
               _M_invoke;
  local_88 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar12.m_data = (storage_type *)0xa;
  QVar12.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar12);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,SAVE_BOARD,(function<void_()> *)&local_98,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_b8._M_unused._0_8_ = slotReadBoard;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_b8._M_unused._0_8_ + 0x10) = this;
  pcStack_a0 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
               _M_invoke;
  local_a8 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar13.m_data = (storage_type *)0xa;
  QVar13.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar13);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,LOAD_BOARD,(function<void_()> *)&local_b8,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_d8._M_unused._0_8_ = slotSettings;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_d8._M_unused._0_8_ + 0x10) = this;
  pcStack_c0 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
               _M_invoke;
  local_c8 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar14.m_data = (storage_type *)0x8;
  QVar14.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar14);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,SETTINGS,(function<void_()> *)&local_d8,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_f8._M_unused._0_8_ = slotAbout;
  *(undefined8 *)((long)local_f8._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_f8._M_unused._0_8_ + 0x10) = this;
  pcStack_e0 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
               _M_invoke;
  local_e8 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar15.m_data = (storage_type *)0x5;
  QVar15.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar15);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,ABOUT,(function<void_()> *)&local_f8,&this->super_QMainWindow,&local_178)
  ;
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  MenuBar::createMenuBar
            ((this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t
             .super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
             super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl,&this->super_QMainWindow);
  QMainWindow::setMenuBar((QMenuBar *)this);
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_158._M_unused._M_object = operator_new(0x18);
  *(code **)local_158._M_unused._0_8_ = slotGenerateBoard;
  *(undefined8 *)((long)local_158._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_158._M_unused._0_8_ + 0x10) = this;
  pcStack_140 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                _M_invoke;
  local_148 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
              _M_manager;
  local_138 = (undefined8 *)0x0;
  uStack_130 = 0;
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138 = (undefined8 *)operator_new(0x18);
  *local_138 = slotSolveBoard;
  local_138[1] = 0;
  local_138[2] = this;
  pcStack_120 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                _M_invoke;
  local_128 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
              _M_manager;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_108[0] = (code *)0x0;
  local_108[1] = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x18);
  *(code **)local_118._M_unused._0_8_ = slotUndoMove;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_118._M_unused._0_8_ + 0x10) = this;
  local_108[1] = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                 _M_invoke;
  local_108[0] = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                 _M_manager;
  pQVar5 = Panel::createLayout((this->panel)._M_t.
                               super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>._M_t.
                               super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                               super__Head_base<0UL,_Panel_*,_false>._M_head_impl,
                               (array<std::function<void_()>,_3UL> *)&local_158,
                               &this->super_QMainWindow);
  pQVar6 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar6,this,0);
  QWidget::setContentsMargins((int)pQVar6,0x14,0x14,0);
  this_01 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_01,pQVar6);
  pQVar7 = TilesBoard::createGroupBox
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  QBoxLayout::addWidget(this_01,pQVar7,0,0);
  QBoxLayout::addLayout((QLayout *)this_01,(int)pQVar5);
  QMainWindow::setCentralWidget((QWidget *)this);
  createTiles(this);
  setTiles(this);
  lVar9 = -0x60;
  p_Var8 = &local_118;
  do {
    if (*(code **)(p_Var8 + 1) != (code *)0x0) {
      (**(code **)(p_Var8 + 1))(p_Var8,p_Var8,3);
    }
    p_Var8 = p_Var8 + -2;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  return;
}

Assistant:

void Fifteen::initGame()
{
    resize( 850, 600 );
    controller = std::make_unique<Controller>();
    tilesBoard = std::make_unique<TilesBoard>( std::bind( &Fifteen::pressTile, this ));
    panel = std::make_unique<Panel>();

    menuBar = std::make_unique<MenuBar>();
    menuBar->bindSlot( ActionMenu::OPEN_GRAPHIC, std::bind( &Fifteen::slotLoadGraphic, this ), this, "Load Graphic File" );
    menuBar->bindSlot( ActionMenu::REM_GRAPHIC, std::bind( &Fifteen::slotRemoveGraphic, this ), this, "Remove Graphic" );
    menuBar->bindSlot( ActionMenu::SAVE_BOARD, std::bind( &Fifteen::slotSaveBoard, this ), this, "Save Board" );
    menuBar->bindSlot( ActionMenu::LOAD_BOARD, std::bind( &Fifteen::slotReadBoard, this ), this, "Load Board" );
    menuBar->bindSlot( ActionMenu::SETTINGS, std::bind( &Fifteen::slotSettings, this ), this, "Settings" );
    menuBar->bindSlot( ActionMenu::ABOUT, std::bind( &Fifteen::slotAbout, this ), this, "About" );

    QMenuBar* menu = menuBar->createMenuBar( this );
    setMenuBar( menu );

    std::array<std::function<void( void )>, 3> panelSlots =
    {
        std::bind( &Fifteen::slotGenerateBoard, this ),
        std::bind( &Fifteen::slotSolveBoard, this ),
        std::bind( &Fifteen::slotUndoMove, this ),
    };
    QVBoxLayout* layout = panel->createLayout( panelSlots, this );

    QWidget* mainPanel = new QWidget( this );
    mainPanel->setContentsMargins( 20, 20, 0, 20 );

    QHBoxLayout* mainLayout = new QHBoxLayout( mainPanel );
    QGroupBox* boxImages = tilesBoard->createGroupBox();
    mainLayout->addWidget( boxImages );
    mainLayout->addLayout( layout );
    setCentralWidget( mainPanel );

    redrawTiles();
}